

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsources.cpp
# Opt level: O2

int __thiscall
jrtplib::RTPSources::ObtainSourceDataInstance
          (RTPSources *this,uint32_t ssrc,RTPInternalSourceData **srcdat,bool *created)

{
  int iVar1;
  RTPInternalSourceData *this_00;
  uint32_t ssrc_local;
  RTPInternalSourceData *srcdat2;
  
  ssrc_local = ssrc;
  iVar1 = RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPInternalSourceData_*,_jrtplib::RTPSources_GetHashIndex,_8317>
          ::GotoElement(&this->sourcelist,&ssrc_local);
  if (iVar1 < 0) {
    this_00 = (RTPInternalSourceData *)operator_new(0x280,(this->super_RTPMemoryObject).mgr,0x18);
    RTPInternalSourceData::RTPInternalSourceData
              (this_00,ssrc_local,this->probationtype,(this->super_RTPMemoryObject).mgr);
    srcdat2 = this_00;
    iVar1 = RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPInternalSourceData_*,_jrtplib::RTPSources_GetHashIndex,_8317>
            ::AddElement(&this->sourcelist,&ssrc_local,&srcdat2);
    if (iVar1 < 0) {
      RTPDelete<jrtplib::RTPInternalSourceData>(srcdat2,(this->super_RTPMemoryObject).mgr);
      return iVar1;
    }
    *srcdat = srcdat2;
    *created = true;
    this->totalcount = this->totalcount + 1;
  }
  else {
    *srcdat = ((this->sourcelist).curhashelem)->element;
    *created = false;
  }
  return 0;
}

Assistant:

int RTPSources::ObtainSourceDataInstance(uint32_t ssrc,RTPInternalSourceData **srcdat,bool *created)
{
	RTPInternalSourceData *srcdat2;
	int status;
	
	if (sourcelist.GotoElement(ssrc) < 0) // No entry for this source
	{
#ifdef RTP_SUPPORT_PROBATION
		srcdat2 = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTPINTERNALSOURCEDATA) RTPInternalSourceData(ssrc,probationtype,GetMemoryManager());
#else
		srcdat2 = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTPINTERNALSOURCEDATA) RTPInternalSourceData(ssrc,RTPSources::NoProbation,GetMemoryManager());
#endif // RTP_SUPPORT_PROBATION
		if (srcdat2 == 0)
			return ERR_RTP_OUTOFMEM;
		if ((status = sourcelist.AddElement(ssrc,srcdat2)) < 0)
		{
			RTPDelete(srcdat2,GetMemoryManager());
			return status;
		}
		*srcdat = srcdat2;
		*created = true;
		totalcount++;
	}
	else
	{
		*srcdat = sourcelist.GetCurrentElement();
		*created = false;
	}
	return 0;
}